

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

bool __thiscall
SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::contains
          (SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *this,InplaceStr *key)

{
  InplaceStr *pIVar1;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  InplaceStr local_48;
  
  uVar5 = this->bucketCount;
  uVar3 = NULLC::GetStringHash(key->begin,key->end);
  uVar7 = 0;
  if (this->bucketCount != 0) {
    uVar5 = uVar5 - 1;
    uVar3 = uVar3 & uVar5;
    uVar6 = uVar5;
    do {
      pIVar1 = this->data;
      local_48.begin = (char *)0x0;
      local_48.end = (char *)0x0;
      bVar2 = InplaceStr::operator==(pIVar1 + uVar3,&local_48);
      if (bVar2) {
        bVar2 = false;
        uVar6 = 0;
      }
      else {
        bVar2 = InplaceStr::operator==(pIVar1 + uVar3,key);
        if (bVar2) {
          uVar6 = 1;
          bVar2 = false;
        }
        else {
          uVar3 = uVar3 + uVar7 + 1 & uVar5;
          bVar2 = true;
        }
      }
      bVar4 = (byte)uVar6;
      if (!bVar2) goto LAB_0017dcb0;
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->bucketCount);
  }
  bVar4 = 0;
LAB_0017dcb0:
  return (bool)(bVar4 & 1);
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}